

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtrans.c
# Opt level: O3

void png_do_invert(png_row_infop row_info,png_bytep row)

{
  size_t sVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  
  if (row_info->color_type == '\x04') {
    if (row_info->bit_depth == '\x10') {
      uVar2 = row_info->rowbytes;
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          row[uVar4] = ~row[uVar4];
          row[uVar4 + 1] = ~row[uVar4 + 1];
          uVar4 = uVar4 + 4;
        } while (uVar4 < uVar2);
      }
    }
    else if ((row_info->bit_depth == '\b') && (uVar2 = row_info->rowbytes, uVar2 != 0)) {
      uVar4 = 0;
      do {
        row[uVar4] = ~row[uVar4];
        uVar4 = uVar4 + 2;
      } while (uVar4 < uVar2);
    }
  }
  else if ((row_info->color_type == '\0') && (sVar1 = row_info->rowbytes, sVar1 != 0)) {
    sVar3 = 0;
    do {
      row[sVar3] = ~row[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_invert(png_row_infop row_info, png_bytep row)
{
   png_debug(1, "in png_do_invert");

  /* This test removed from libpng version 1.0.13 and 1.2.0:
   *   if (row_info->bit_depth == 1 &&
   */
   if (row_info->color_type == PNG_COLOR_TYPE_GRAY)
   {
      png_bytep rp = row;
      size_t i;
      size_t istop = row_info->rowbytes;

      for (i = 0; i < istop; i++)
      {
         *rp = (png_byte)(~(*rp));
         rp++;
      }
   }

   else if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA &&
      row_info->bit_depth == 8)
   {
      png_bytep rp = row;
      size_t i;
      size_t istop = row_info->rowbytes;

      for (i = 0; i < istop; i += 2)
      {
         *rp = (png_byte)(~(*rp));
         rp += 2;
      }
   }

#ifdef PNG_16BIT_SUPPORTED
   else if (row_info->color_type == PNG_COLOR_TYPE_GRAY_ALPHA &&
      row_info->bit_depth == 16)
   {
      png_bytep rp = row;
      size_t i;
      size_t istop = row_info->rowbytes;

      for (i = 0; i < istop; i += 4)
      {
         *rp = (png_byte)(~(*rp));
         *(rp + 1) = (png_byte)(~(*(rp + 1)));
         rp += 4;
      }
   }
#endif
}